

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void __thiscall Layout::addItem(Layout *this,LayoutItem *item)

{
  LayoutItem *this_00;
  LayoutItem *local_20;
  LayoutItem *flex;
  LayoutItem *item_local;
  Layout *this_local;
  
  flex = item;
  item_local = (LayoutItem *)this;
  if (((this->m_insertFlexSpacer & 1U) != 0) && (item->m_ltype == TYPE_CELL)) {
    this_00 = (LayoutItem *)operator_new(0x90);
    LayoutItem::LayoutItem(this_00,TYPE_FLEXSPACE);
    this_00->m_size = -1.0;
    local_20 = this_00;
    setItemEdgePos(this,this_00);
    std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::push_back
              (&this->m_items,&local_20);
  }
  std::__cxx11::list<LayoutItem_*,_std::allocator<LayoutItem_*>_>::push_back(&this->m_items,&flex);
  if (flex->m_ltype == TYPE_CELL) {
    this->m_insertFlexSpacer = true;
  }
  else {
    this->m_insertFlexSpacer = false;
  }
  return;
}

Assistant:

void addItem(LayoutItem *item)
    {
        if ((m_insertFlexSpacer) &&
             (item->m_ltype == LayoutItem::TYPE_CELL))
        {
            LayoutItem *flex = new LayoutItem(LayoutItem::TYPE_FLEXSPACE);
            flex->m_size = -1;
            setItemEdgePos(flex);
            m_items.push_back(flex);
        }

        m_items.push_back(item);
        
        if (item->m_ltype == LayoutItem::TYPE_CELL)
        {
            // auto-insert a flex space the next time
            // a regular CELL is inserted.
            //
            // this way, there will always be a flex
            // space between regular cells unless
            // we insert a fixed spacer or offset.
            m_insertFlexSpacer = true;
        }
        else
        {
            m_insertFlexSpacer = false;
        }
    }